

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomized_attacker_strategy.cpp
# Opt level: O0

void __thiscall
RandomizedAttackerStrategy::generateActions
          (RandomizedAttackerStrategy *this,PlayerSight *sight,Actions *actions)

{
  int target_id;
  pointer this_00;
  const_reference pvVar1;
  size_type sVar2;
  reference pvVar3;
  float fVar4;
  Vec2 local_70;
  int *local_68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  Vec2 local_44;
  value_type local_3c;
  undefined1 local_38 [4];
  int i;
  vector<int,_std::allocator<int>_> targets;
  Actions *actions_local;
  PlayerSight *sight_local;
  RandomizedAttackerStrategy *this_local;
  
  if ((((this->super_Strategy).disabled & 1U) == 0) && ((sight->canSuckAttack & 1U) != 0)) {
    targets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)actions;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_38);
    for (local_3c = 0; local_3c < sight->unitInSightCount; local_3c = local_3c + 1) {
      pvVar1 = std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>::operator[]
                         (&sight->unitInSight,(long)local_3c);
      local_44 = Vec2::operator-(&pvVar1->pos,&sight->pos);
      fVar4 = Vec2::length(&local_44);
      if (fVar4 <= 4.0) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_38,&local_3c);
      }
    }
    local_60._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_38);
    local_68 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)local_38);
    std::random_shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (local_60,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_68)
    ;
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_38);
    this_00 = targets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage;
    if (sVar2 != 0) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_38,0);
      pvVar1 = std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>::operator[]
                         (&sight->unitInSight,(long)*pvVar3);
      target_id = pvVar1->id;
      Vec2::Vec2(&local_70,0.0,0.0);
      Actions::emplace((Actions *)this_00,SuckAttack,target_id,local_70);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  }
  return;
}

Assistant:

void RandomizedAttackerStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    if (!sight.canSuckAttack)
        return;
    vector<int> targets;
    for (int i = 0; i < sight.unitInSightCount; ++i)
        if ((sight.unitInSight[i].pos - sight.pos).length() <= SuckRange)
            targets.push_back(i);
    random_shuffle(targets.begin(), targets.end());
	if (targets.size() > 0)
		actions->emplace(SuckAttack, sight.unitInSight[targets[0]].id, Vec2());
}